

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int jmp_follow(Parser *psr,int jmp_idx)

{
  uint32_t uVar1;
  Function *pFVar2;
  int offset;
  BcIns *jmp;
  int jmp_idx_local;
  Parser *psr_local;
  
  psr_local._4_4_ = jmp_idx;
  if (-1 < jmp_idx) {
    pFVar2 = psr_fn(psr);
    uVar1 = bc_arg24(pFVar2->ins[jmp_idx]);
    psr_local._4_4_ = jmp_idx + (uVar1 - 0x7fffff);
  }
  return psr_local._4_4_;
}

Assistant:

static int jmp_follow(Parser *psr, int jmp_idx) {
	if (jmp_idx < 0) {
		return jmp_idx;
	}

	// Remember, the jump offset is relative to the instruction that FOLLOWS the
	// jump instruction
	BcIns *jmp = &psr_fn(psr)->ins[jmp_idx];

	// The reason we use a jump bias is best explained by considering the
	// alternatives. The first is to use signed offsets, and the second is to
	// split forward and backward jumps into two separate opcodes.
	//
	// Signed offsets are problematic because extracting instruction arguments
	// in the assembly interpreter is done using `shr` and `movzx` instructions.
	// Both of which ignore the sign bit.
	//
	// Splitting into a forward and backward jump opcode is problematic because
	// we use `lea` instruction to perform jumps in the assembly interpreter:
	//   lea PC, [PC + (RC - JMP_BIAS) * 4]
	// We use `lea` because it can execute in parallel with arithmetic
	// operations on the ALU, making the interpreter faster. `lea` doesn't
	// support subtraction of registers:
	//   lea PC, [PC - RC * 4]   ; NOT SUPPORTED
	// So a backwards jump opcode wouldn't be possible.
	//
	// BUT, `lea` does support subtraction of constants!
	//  lea PC, [PC + RC * 4 - JMP_BIAS * 4]
	// Thus, we use a jump bias.
	//
	// Jump offsets are stored in 24 bit integers. Thus, the jump bias is
	// defined as half the maximum value of a 24-bit integer = 2^24 / 2 = 2^23
	// = 0x800000.
	int offset = bc_arg24(*jmp) - JMP_BIAS + 1;
	return jmp_idx + offset;
}